

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Vector3 Vector3Perpendicular(Vector3 v)

{
  float fVar1;
  float fVar3;
  undefined1 auVar2 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Vector3 VVar9;
  
  fVar4 = v.z;
  auVar2._0_8_ = v._0_8_;
  auVar2._8_8_ = v._0_8_;
  fVar1 = SUB164(auVar2 & _DAT_001b5cb0,0);
  fVar3 = SUB164(auVar2 & _DAT_001b5cb0,4);
  fVar6 = fVar3;
  if (fVar1 <= fVar3) {
    fVar6 = fVar1;
  }
  fVar5 = (float)((uint)DAT_001b5cb0 & (uint)fVar4);
  fVar7 = 0.0;
  fVar8 = 0.0;
  if (fVar6 <= fVar5) {
    fVar7 = (float)(-(uint)(fVar3 < fVar1) & 0x3f800000);
    fVar8 = 1.0;
  }
  fVar5 = (float)(-(uint)(fVar5 < fVar6) & 0x3f800000);
  fVar6 = 0.0;
  if (fVar1 <= fVar3) {
    fVar6 = fVar8;
  }
  VVar9.x = v.y * fVar5 - fVar7 * fVar4;
  VVar9.y = fVar4 * fVar6 - fVar5 * v.x;
  VVar9.z = v.x * fVar7 - fVar6 * v.y;
  return VVar9;
}

Assistant:

RMAPI Vector3 Vector3Perpendicular(Vector3 v)
{
    Vector3 result = { 0 };

    float min = fabsf(v.x);
    Vector3 cardinalAxis = {1.0f, 0.0f, 0.0f};

    if (fabsf(v.y) < min)
    {
        min = fabsf(v.y);
        Vector3 tmp = {0.0f, 1.0f, 0.0f};
        cardinalAxis = tmp;
    }

    if (fabsf(v.z) < min)
    {
        Vector3 tmp = {0.0f, 0.0f, 1.0f};
        cardinalAxis = tmp;
    }

    // Cross product between vectors
    result.x = v.y*cardinalAxis.z - v.z*cardinalAxis.y;
    result.y = v.z*cardinalAxis.x - v.x*cardinalAxis.z;
    result.z = v.x*cardinalAxis.y - v.y*cardinalAxis.x;

    return result;
}